

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O3

int FmsDataCollectionAddField(FmsDataCollection dc,char *field_name,FmsField *field)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  FmsField __ptr;
  char *pcVar4;
  int iVar5;
  FmsField *local_40;
  
  if (dc == (FmsDataCollection)0x0) {
    return 1;
  }
  if (field == (FmsField *)0x0) {
    return 2;
  }
  uVar1 = dc->num_fields;
  local_40 = dc->fields;
  uVar2 = 1;
  do {
    uVar3 = uVar2;
    uVar2 = uVar3 * 2;
  } while (uVar3 < uVar1 + 1);
  if (uVar3 >> 1 < uVar1) {
LAB_00107d53:
    __ptr = (FmsField)calloc(1,0x30);
    if (__ptr == (FmsField)0x0) {
      return 3;
    }
    iVar5 = 0;
    if (field_name == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = strdup(field_name);
      if (pcVar4 == (char *)0x0) {
        free(__ptr);
        goto LAB_00107d8d;
      }
    }
    __ptr->name = pcVar4;
    dc->num_fields = uVar1 + 1;
    local_40[uVar1] = __ptr;
    *field = __ptr;
  }
  else {
    local_40 = (FmsField *)realloc(local_40,uVar3 << 3);
    if (local_40 != (FmsField *)0x0) {
      dc->fields = local_40;
      goto LAB_00107d53;
    }
LAB_00107d8d:
    iVar5 = 3;
  }
  return iVar5;
}

Assistant:

int FmsDataCollectionAddField(FmsDataCollection dc, const char *field_name,
                              FmsField *field) {
  if (!dc) { E_RETURN(1); }
  if (!field) { E_RETURN(2); }
  const FmsInt num_fields = dc->num_fields;
  FmsField *fields = dc->fields;
  // Reallocate dc->fields, if necessary
  const FmsInt nc = NextPow2(num_fields + 1);
  if (num_fields <= nc/2) {
    fields = realloc(fields, nc*sizeof(*fields));
    if (fields == NULL) { E_RETURN(3); }
    dc->fields = fields;
  }
  FmsField new_field;
  new_field = calloc(1, sizeof(*new_field));
  if (new_field == NULL) { E_RETURN(3); }
  // On error, call free(new_field)
  if (FmsCopyString(field_name, &new_field->name)) {
    free(new_field); E_RETURN(3);
  }
  // Update the field
  dc->num_fields = num_fields + 1;
  dc->fields[num_fields] = new_field;
  *field = new_field;
  return 0;
}